

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O1

void Llb_MtrPrint(Llb_Mtr_t *p,int fOrder)

{
  int *__ptr;
  int __c;
  uint uVar1;
  long lVar2;
  long lVar3;
  
  if (fOrder == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = Llb_MtrFindVarOrder(p);
  }
  if (0 < p->nRows) {
    lVar2 = 0;
    do {
      if (__ptr == (int *)0x0) {
        uVar1 = (uint)lVar2;
      }
      else {
        uVar1 = __ptr[lVar2];
      }
      printf("%3d : ",(ulong)uVar1);
      printf("%3d ",(ulong)(uint)p->pRowSums[(int)uVar1]);
      if ((int)uVar1 < p->nPis) {
        Llb_MtrVarName::Buffer._0_4_ = (uint)(byte)Llb_MtrVarName::Buffer[3] << 0x18;
        Llb_MtrVarName::Buffer[0] = 'p';
        Llb_MtrVarName::Buffer[1] = 'i';
      }
      else if ((int)uVar1 < p->nPis + p->nFfs) {
        Llb_MtrVarName::Buffer._0_4_ = (uint)(byte)Llb_MtrVarName::Buffer[3] << 0x18;
        Llb_MtrVarName::Buffer[0] = 'C';
        Llb_MtrVarName::Buffer[1] = 'S';
      }
      else if ((int)uVar1 < p->nRows - p->nFfs) {
        builtin_strncpy(Llb_MtrVarName::Buffer,"int",4);
      }
      else {
        Llb_MtrVarName::Buffer._0_4_ = (uint)(byte)Llb_MtrVarName::Buffer[3] << 0x18;
        Llb_MtrVarName::Buffer[0] = 'N';
        Llb_MtrVarName::Buffer[1] = 'S';
      }
      printf("%3s ",Llb_MtrVarName::Buffer);
      if (0 < p->nCols) {
        lVar3 = 0;
        do {
          __c = 0x20;
          if (p->pMatrix[lVar3][(int)uVar1] != '\0') {
            __c = 0x2a;
          }
          putchar(__c);
          lVar3 = lVar3 + 1;
        } while (lVar3 < p->nCols);
      }
      putchar(10);
      lVar2 = lVar2 + 1;
    } while (lVar2 < p->nRows);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Llb_MtrPrint( Llb_Mtr_t * p, int fOrder )
{
    int * pOrder = NULL;
    int i, iRow, iCol;
    if ( fOrder )
        pOrder = Llb_MtrFindVarOrder( p );
    for ( i = 0; i < p->nRows; i++ )
    {
        iRow = pOrder ? pOrder[i] : i;
        printf( "%3d : ", iRow );
        printf( "%3d ", p->pRowSums[iRow] );
        printf( "%3s ", Llb_MtrVarName(p, iRow) );
        for ( iCol = 0; iCol < p->nCols; iCol++ )
            printf( "%c", p->pMatrix[iCol][iRow] ? '*' : ' ' );
        printf( "\n" );
    }
    ABC_FREE( pOrder );
}